

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void place_stairs(chunk_conflict *c,loc_conflict grid,wchar_t feat)

{
  level_conflict *plVar1;
  level_conflict *plVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t place;
  wchar_t *pwVar5;
  bool bVar6;
  
  plVar2 = world->levels;
  place = (wchar_t)player->place;
  plVar1 = plVar2 + place;
  _Var3 = quest_forbid_downstairs(place);
  _Var4 = true;
  if (plVar2[place].up == (char *)0x0) {
    _Var4 = mountain_top_possible(plVar1->index);
  }
  bVar6 = !_Var3;
  if (plVar1->down == (char *)0x0) {
    _Var3 = underworld_possible(plVar1->index);
    bVar6 = bVar6 && _Var3;
  }
  if (_Var4 == false) {
    if (!bVar6) {
      return;
    }
    pwVar5 = &FEAT_MORE;
  }
  else {
    if (bVar6) goto LAB_0015530e;
    pwVar5 = &FEAT_LESS;
  }
  feat = *pwVar5;
LAB_0015530e:
  square_set_feat(c,(loc)grid,feat);
  return;
}

Assistant:

void place_stairs(struct chunk *c, struct loc grid, int feat)
{
	struct level *current = &world->levels[player->place];
	bool down = true, up = true;

	/* Can't leave quest levels */
	if (quest_forbid_downstairs(player->place))
		down = false;

	/* Deal with underworld and mountain top */
	if (!current->up && !mountain_top_possible(current->index)) {
		up = false;
	}
	if (!current->down && !underworld_possible(current->index)) {
		down = false;
	}

	/* Determine up/down if not already done */
	if (up && down) {
		square_set_feat(c, grid, feat);
	} else if (up) {
		square_set_feat(c, grid, FEAT_LESS);
	} else if (down) {
		square_set_feat(c, grid, FEAT_MORE);
	}
}